

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O0

int __thiscall vkt::Draw::IndirectDrawTests::init(IndirectDrawTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  undefined8 uVar2;
  TestError *this_00;
  TestNode *pTVar3;
  char *name;
  char *description;
  TestCaseGroup *pTVar4;
  mapped_type *ppcVar5;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *pIVar6;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
  *pIVar7;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
  *pIVar8;
  IndirectDrawTests *pIVar9;
  DrawTypedTestSpec local_4d0;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  undefined1 local_441;
  DrawTypedTestSpec local_440;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  key_type local_3b8 [2];
  undefined1 local_3b0 [8];
  TestSpec testSpec_2;
  TestCaseGroup *firstInstanceGroup;
  DrawTypedTestSpec local_368;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  undefined1 local_2d9;
  DrawTypedTestSpec local_2d8;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  key_type local_250 [2];
  undefined1 local_248 [8];
  TestSpec testSpec_1;
  TestCaseGroup *noFirstInstanceGroup;
  TestCaseGroup *indirectDrawInstancedGroup;
  DrawTypedTestSpec local_1f8;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  undefined1 local_169;
  DrawTypedTestSpec local_168;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  key_type local_e0 [2];
  undefined1 local_d8 [8];
  TestSpec testSpec;
  TestCaseGroup *indirectDrawGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  TestNode *local_50;
  TestCaseGroup *drawTypeGroup;
  undefined1 local_38 [8];
  string drawTypeStr;
  int drawTypeIdx;
  IndirectDrawTests *this_local;
  
  drawTypeStr.field_2._12_4_ = 0;
  pIVar9 = this;
  do {
    if (1 < (int)drawTypeStr.field_2._12_4_) {
      return (int)pIVar9;
    }
    std::__cxx11::string::string((string *)local_38);
    if (drawTypeStr.field_2._12_4_ == 0) {
      std::__cxx11::string::operator=((string *)local_38,"sequential");
    }
    else {
      if (drawTypeStr.field_2._12_4_ != 1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x2fa);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator=((string *)local_38,"indexed");
    }
    pTVar3 = (TestNode *)operator_new(0x70);
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    name = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_90,"Draws geometry using ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::operator+(&local_70,&local_90,"draw call");
    description = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar1,name,description);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    local_50 = pTVar3;
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"indirect_draw",
               "Draws geometry");
    testSpec.super_TestSpecBase._48_8_ = pTVar4;
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec((DrawTypedTestSpec *)local_d8);
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         drawTypeStr.field_2._12_4_;
    local_e0[1] = 0;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)local_d8,local_e0 + 1);
    *ppcVar5 = "vulkan/draw/VertexFetch.vert";
    local_e0[0] = SHADERTYPE_FRAGMENT;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)local_d8,local_e0);
    uVar2 = testSpec.super_TestSpecBase._48_8_;
    *ppcVar5 = "vulkan/draw/VertexFetch.frag";
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3;
    pIVar6 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *)operator_new(0xa8);
    local_169 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"triangle_list",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"Draws triangle list",&local_129);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_168,(DrawTypedTestSpec *)local_d8);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw>::InstanceFactory
              (pIVar6,pTVar1,&local_100,&local_128,&local_168);
    local_169 = 0;
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pIVar6);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec(&local_168);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    uVar2 = testSpec.super_TestSpecBase._48_8_;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
    pIVar6 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *)operator_new(0xa8);
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"triangle_strip",&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"Draws triangle strip",&local_1b9);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_1f8,(DrawTypedTestSpec *)local_d8);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw>::InstanceFactory
              (pIVar6,pTVar1,&local_190,&local_1b8,&local_1f8);
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pIVar6);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec(&local_1f8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec((DrawTypedTestSpec *)local_d8);
    tcu::TestNode::addChild(local_50,(TestNode *)testSpec.super_TestSpecBase._48_8_);
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               "indirect_draw_instanced","Draws an instanced geometry");
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"no_first_instance",
               "Use 0 as firstInstance");
    testSpec_1.super_TestSpecBase._48_8_ = pTVar4;
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec((DrawTypedTestSpec *)local_248);
    testSpec_1.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         drawTypeStr.field_2._12_4_;
    local_250[1] = 0;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)local_248,local_250 + 1);
    *ppcVar5 = "vulkan/draw/VertexFetchInstanced.vert";
    local_250[0] = SHADERTYPE_FRAGMENT;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)local_248,local_250);
    uVar2 = testSpec_1.super_TestSpecBase._48_8_;
    *ppcVar5 = "vulkan/draw/VertexFetch.frag";
    testSpec_1.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3
    ;
    pIVar7 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
              *)operator_new(0xa8);
    local_2d9 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"triangle_list",&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"Draws an instanced triangle list",&local_299);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_2d8,(DrawTypedTestSpec *)local_248);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
    ::InstanceFactory(pIVar7,pTVar1,&local_270,&local_298,&local_2d8);
    local_2d9 = 0;
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pIVar7);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec(&local_2d8);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    uVar2 = testSpec_1.super_TestSpecBase._48_8_;
    testSpec_1.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4
    ;
    pIVar7 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
              *)operator_new(0xa8);
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"triangle_strip",&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"Draws an instanced triangle strip",&local_329);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_368,(DrawTypedTestSpec *)local_248);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
    ::InstanceFactory(pIVar7,pTVar1,&local_300,&local_328,&local_368);
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pIVar7);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec(&local_368);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec((DrawTypedTestSpec *)local_248);
    tcu::TestNode::addChild(pTVar3,(TestNode *)testSpec_1.super_TestSpecBase._48_8_);
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"first_instance",
               "Use drawIndirectFirstInstance optional feature");
    testSpec_2.super_TestSpecBase._48_8_ = pTVar4;
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec((DrawTypedTestSpec *)local_3b0);
    testSpec_2.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         drawTypeStr.field_2._12_4_;
    local_3b8[1] = 0;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)local_3b0,local_3b8 + 1);
    *ppcVar5 = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
    local_3b8[0] = SHADERTYPE_FRAGMENT;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)local_3b0,local_3b8);
    uVar2 = testSpec_2.super_TestSpecBase._48_8_;
    *ppcVar5 = "vulkan/draw/VertexFetch.frag";
    testSpec_2.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3
    ;
    pIVar8 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
              *)operator_new(0xa8);
    local_441 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"triangle_list",&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"Draws an instanced triangle list",&local_401);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_440,(DrawTypedTestSpec *)local_3b0);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
    ::InstanceFactory(pIVar8,pTVar1,&local_3d8,&local_400,&local_440);
    local_441 = 0;
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pIVar8);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec(&local_440);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    uVar2 = testSpec_2.super_TestSpecBase._48_8_;
    testSpec_2.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4
    ;
    pIVar8 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
              *)operator_new(0xa8);
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"triangle_strip",&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"Draws an instanced triangle strip",&local_491);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_4d0,(DrawTypedTestSpec *)local_3b0);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
    ::InstanceFactory(pIVar8,pTVar1,&local_468,&local_490,&local_4d0);
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pIVar8);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec(&local_4d0);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec((DrawTypedTestSpec *)local_3b0);
    tcu::TestNode::addChild(pTVar3,(TestNode *)testSpec_2.super_TestSpecBase._48_8_);
    tcu::TestNode::addChild(local_50,pTVar3);
    tcu::TestNode::addChild((TestNode *)this,local_50);
    std::__cxx11::string::~string((string *)local_38);
    drawTypeStr.field_2._12_4_ = drawTypeStr.field_2._12_4_ + 1;
    pIVar9 = (IndirectDrawTests *)(ulong)(uint)drawTypeStr.field_2._12_4_;
  } while( true );
}

Assistant:

void IndirectDrawTests::init (void)
{
	for (int drawTypeIdx = 0; drawTypeIdx < DRAWTYPE_LAST; drawTypeIdx++)
	{
		std::string drawTypeStr;
		switch (drawTypeIdx)
		{
			case DRAW_TYPE_SEQUENTIAL:
				drawTypeStr = "sequential";
				break;
			case DRAW_TYPE_INDEXED:
				drawTypeStr = "indexed";
				break;
			default:
				TCU_FAIL("impossible");
		}

		tcu::TestCaseGroup* drawTypeGroup = new tcu::TestCaseGroup(m_testCtx, drawTypeStr.c_str(), ("Draws geometry using " + drawTypeStr + "draw call").c_str());
		{
			tcu::TestCaseGroup* indirectDrawGroup = new tcu::TestCaseGroup(m_testCtx, "indirect_draw", "Draws geometry");
			{
				IndirectDraw::TestSpec testSpec;
				testSpec.drawType = static_cast<DrawType>(drawTypeIdx);
				testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetch.vert";
				testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";
				testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
				indirectDrawGroup->addChild(new InstanceFactory<IndirectDraw>(m_testCtx, "triangle_list", "Draws triangle list", testSpec));
				testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
				indirectDrawGroup->addChild(new InstanceFactory<IndirectDraw>(m_testCtx, "triangle_strip", "Draws triangle strip", testSpec));
			}
			drawTypeGroup->addChild(indirectDrawGroup);


			tcu::TestCaseGroup* indirectDrawInstancedGroup = new tcu::TestCaseGroup(m_testCtx, "indirect_draw_instanced", "Draws an instanced geometry");
			{
				tcu::TestCaseGroup*	noFirstInstanceGroup = new tcu::TestCaseGroup(m_testCtx, "no_first_instance", "Use 0 as firstInstance");
				{
					IndirectDrawInstanced<FirtsInstanceNotSupported>::TestSpec testSpec;
					testSpec.drawType = static_cast<DrawType>(drawTypeIdx);

					testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstanced.vert";
					testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
					noFirstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceNotSupported> >(m_testCtx, "triangle_list", "Draws an instanced triangle list", testSpec));
					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
					noFirstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceNotSupported> >(m_testCtx, "triangle_strip", "Draws an instanced triangle strip", testSpec));
				}
				indirectDrawInstancedGroup->addChild(noFirstInstanceGroup);

				tcu::TestCaseGroup*	firstInstanceGroup = new tcu::TestCaseGroup(m_testCtx, "first_instance", "Use drawIndirectFirstInstance optional feature");
				{
					IndirectDrawInstanced<FirtsInstanceSupported>::TestSpec testSpec;
					testSpec.drawType = static_cast<DrawType>(drawTypeIdx);

					testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
					testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
					firstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceSupported> >(m_testCtx, "triangle_list", "Draws an instanced triangle list", testSpec));
					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
					firstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceSupported> >(m_testCtx, "triangle_strip", "Draws an instanced triangle strip", testSpec));
				}
				indirectDrawInstancedGroup->addChild(firstInstanceGroup);
			}
			drawTypeGroup->addChild(indirectDrawInstancedGroup);
		}

		addChild(drawTypeGroup);
	}
}